

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  ushort *puVar1;
  undefined2 uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  sbyte sVar6;
  int iVar7;
  size_t sVar8;
  BYTE *pBVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong uVar16;
  ulong *puVar17;
  int iVar18;
  byte *pbVar19;
  char cVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  byte *pbVar25;
  byte *pbVar26;
  size_t sVar27;
  byte *pbVar28;
  bool bVar29;
  bool bVar30;
  BIT_DStream_t BStack_1f8;
  byte *pbStack_1d0;
  undefined1 auStack_1c8 [8];
  undefined8 uStack_1c0;
  ulong *puStack_1b8;
  ulong *puStack_1b0;
  ulong *puStack_1a8;
  byte *pbStack_1a0;
  undefined1 auStack_198 [8];
  undefined8 uStack_190;
  byte *pbStack_188;
  byte *pbStack_180;
  byte *pbStack_178;
  ulong *puStack_170;
  byte *pbStack_168;
  ushort *puStack_160;
  ulong uStack_158;
  ulong *puStack_150;
  ulong uStack_148;
  size_t sStack_140;
  byte *pbStack_138;
  byte *pbStack_130;
  byte *pbStack_128;
  byte *pbStack_120;
  ushort *puStack_118;
  byte *pbStack_110;
  HUF_DecompressFastArgs HStack_108;
  size_t sStack_68;
  byte *pbStack_60;
  byte *pbStack_58;
  ulong *puStack_50;
  ulong *puStack_48;
  ulong uStack_40;
  ushort *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar8 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar8;
  }
  if ((flags & 0x20U) == 0) {
    puStack_160 = (ushort *)cSrc;
    sStack_140 = HUF_DecompressFastArgs_init(&HStack_108,dst,maxDstSize,cSrc,cSrcSize,DTable);
    sVar8 = sStack_140;
    if (sStack_140 - 1 < 0xffffffffffffff88) {
      puStack_170 = (ulong *)cSrcSize;
      if (HStack_108.ip[0] < HStack_108.ilimit) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x329,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      puVar1 = puStack_160 + 3;
      pbStack_1d0 = (byte *)((long)dst + maxDstSize);
      BStack_1f8.bitContainer = HStack_108.bits[0];
      BStack_1f8._8_8_ = HStack_108.bits[1];
      BStack_1f8.ptr = (char *)HStack_108.bits[2];
      BStack_1f8.start = (char *)HStack_108.bits[3];
      auStack_1c8 = (undefined1  [8])HStack_108.ip[0];
      uStack_1c0 = (ushort *)HStack_108.ip[1];
      puStack_1b8 = (ulong *)HStack_108.ip[2];
      puStack_1b0 = (ulong *)HStack_108.ip[3];
      auStack_198 = (undefined1  [8])HStack_108.op[0];
      uStack_190 = HStack_108.op[1];
      pbStack_188 = HStack_108.op[2];
      pbStack_180 = HStack_108.op[3];
      lVar11 = 0;
      do {
        do {
          pBVar9 = HStack_108.oend;
          if (lVar11 != 3) {
            pBVar9 = (BYTE *)(&uStack_190)[lVar11];
          }
          if (pBVar9 < *(BYTE **)(auStack_198 + lVar11 * 8)) {
            __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2c9,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          if (*(ushort **)(auStack_1c8 + lVar11 * 8) < HStack_108.ilimit) {
            __assert_fail("ip[stream] >= ilimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2ca,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        uVar12 = (ulong)((long)HStack_108.oend - (long)pbStack_180) / 5;
        uVar16 = (ulong)((long)auStack_1c8 - (long)HStack_108.ilimit) / 7;
        if (uVar12 < uVar16) {
          uVar16 = uVar12;
        }
        if ((long)(uVar16 * 5) < 0x14) {
          iVar7 = 2;
          bVar29 = false;
        }
        else {
          lVar11 = 1;
          do {
            bVar29 = *(byte **)(auStack_1c8 + lVar11 * 8) >= (&pbStack_1d0)[lVar11];
            if (*(byte **)(auStack_1c8 + lVar11 * 8) < (&pbStack_1d0)[lVar11]) {
              iVar7 = 10;
              goto LAB_002213f2;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          iVar7 = 0;
          bVar29 = true;
        }
LAB_002213f2:
        if (bVar29) {
          pbVar25 = pbStack_180 + uVar16 * 5;
          lVar11 = 1;
          do {
            if (*(byte **)(auStack_1c8 + lVar11 * 8) < (&pbStack_1d0)[lVar11]) {
              __assert_fail("ip[stream] >= ip[stream - 1]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                            ,0x2ef,
                            "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                           );
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          lVar11 = 0;
          do {
            do {
              lVar13 = 0;
              do {
                uVar2 = *(undefined2 *)
                         ((long)HStack_108.dt + ((&BStack_1f8.bitContainer)[lVar13] >> 0x35) * 2);
                (&BStack_1f8.bitContainer)[lVar13] =
                     (&BStack_1f8.bitContainer)[lVar13] << ((byte)uVar2 & 0x3f);
                *(char *)(*(long *)(auStack_198 + lVar13 * 8) + lVar11) = (char)((ushort)uVar2 >> 8)
                ;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 5);
            lVar11 = 0;
            do {
              uVar16 = (&BStack_1f8.bitContainer)[lVar11];
              if (uVar16 == 0) {
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                              ,0x5c,"unsigned int ZSTD_countTrailingZeros64(U64)");
              }
              uVar12 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              *(long *)(auStack_198 + lVar11 * 8) = *(long *)(auStack_198 + lVar11 * 8) + 5;
              puVar17 = (ulong *)(*(long *)(auStack_1c8 + lVar11 * 8) - (uVar12 >> 3 & 0x1fffffff));
              *(ulong **)(auStack_1c8 + lVar11 * 8) = puVar17;
              (&BStack_1f8.bitContainer)[lVar11] = (*puVar17 | 1) << ((byte)uVar12 & 7);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            lVar11 = 0;
            iVar7 = 0;
          } while (pbStack_180 < pbVar25);
        }
        lVar11 = 0;
      } while (iVar7 == 0);
      HStack_108.bits[2] = (U64)BStack_1f8.ptr;
      HStack_108.bits[3] = (U64)BStack_1f8.start;
      HStack_108.bits[0] = BStack_1f8.bitContainer;
      HStack_108.bits[1] = BStack_1f8._8_8_;
      HStack_108.ip[0] = (BYTE *)auStack_1c8;
      HStack_108.ip[1] = (BYTE *)uStack_1c0;
      HStack_108.ip[2] = (BYTE *)puStack_1b8;
      HStack_108.ip[3] = (BYTE *)puStack_1b0;
      HStack_108.op[2] = pbStack_188;
      HStack_108.op[3] = pbStack_180;
      HStack_108.op[0] = (BYTE *)auStack_198;
      HStack_108.op[1] = uStack_190;
      if ((ulong)auStack_1c8 < puVar1) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x32f,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (uStack_1c0 < puVar1) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x330,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (puStack_1b8 < puVar1) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x331,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (puStack_1b0 < puVar1) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x332,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (pbStack_1d0 < pbStack_180) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x333,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      pbStack_168 = (byte *)(maxDstSize + 3 >> 2);
      uVar16 = 0;
      bVar29 = false;
      sVar27 = sStack_140;
      pbStack_1a0 = (byte *)dst;
      sStack_68 = maxDstSize;
LAB_00221564:
      lVar11 = -(long)dst;
      dst = (byte *)((long)dst + (long)pbStack_168);
      if (pbStack_1d0 + lVar11 < pbStack_168) {
        dst = pbStack_1d0;
      }
      sVar8 = HUF_initRemainingDStream(&BStack_1f8,&HStack_108,(int)uVar16,(BYTE *)dst);
      if (sVar8 < 0xffffffffffffff89) {
        pbVar25 = HStack_108.op[uVar16];
        lVar11 = (long)dst - (long)pbVar25;
        if (3 < lVar11) {
          do {
            if (BStack_1f8.bitsConsumed < 0x41) {
              if (BStack_1f8.ptr < BStack_1f8.limitPtr) {
                if (BStack_1f8.ptr == BStack_1f8.start) goto LAB_002215e5;
                bVar30 = BStack_1f8.start <=
                         (size_t *)((long)BStack_1f8.ptr - (ulong)(BStack_1f8.bitsConsumed >> 3));
                uVar24 = (int)BStack_1f8.ptr - (int)BStack_1f8.start;
                if (bVar30) {
                  uVar24 = BStack_1f8.bitsConsumed >> 3;
                }
                BStack_1f8.bitsConsumed = BStack_1f8.bitsConsumed + uVar24 * -8;
              }
              else {
                uVar24 = BStack_1f8.bitsConsumed >> 3;
                BStack_1f8.bitsConsumed = BStack_1f8.bitsConsumed & 7;
                bVar30 = true;
              }
              BStack_1f8.ptr = (char *)((long)BStack_1f8.ptr - (ulong)uVar24);
              BStack_1f8.bitContainer = *(size_t *)BStack_1f8.ptr;
            }
            else {
LAB_002215e5:
              bVar30 = false;
            }
            if (((byte *)((long)dst + -3) <= pbVar25) || (!bVar30)) goto LAB_0022170b;
            uVar12 = (BStack_1f8.bitContainer << ((byte)BStack_1f8.bitsConsumed & 0x3f)) >> 0x35;
            iVar7 = *(byte *)((long)DTable + uVar12 * 2 + 4) + BStack_1f8.bitsConsumed;
            *pbVar25 = *(byte *)((long)DTable + uVar12 * 2 + 5);
            uVar12 = (BStack_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> 0x35;
            iVar7 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar7;
            pbVar25[1] = *(byte *)((long)DTable + uVar12 * 2 + 5);
            uVar12 = (BStack_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> 0x35;
            iVar7 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar7;
            pbVar25[2] = *(byte *)((long)DTable + uVar12 * 2 + 5);
            uVar12 = (BStack_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> 0x35;
            BStack_1f8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar7;
            pbVar25[3] = *(byte *)((long)DTable + uVar12 * 2 + 5);
            pbVar25 = pbVar25 + 4;
          } while( true );
        }
        if (BStack_1f8.bitsConsumed < 0x41) {
          if (BStack_1f8.ptr < BStack_1f8.limitPtr) {
            if (BStack_1f8.ptr == BStack_1f8.start) goto LAB_0022173d;
            uVar24 = (int)BStack_1f8.ptr - (int)BStack_1f8.start;
            if (BStack_1f8.start <=
                (size_t *)((long)BStack_1f8.ptr - (ulong)(BStack_1f8.bitsConsumed >> 3))) {
              uVar24 = BStack_1f8.bitsConsumed >> 3;
            }
            BStack_1f8.ptr = (char *)((long)BStack_1f8.ptr - (ulong)uVar24);
            BStack_1f8.bitsConsumed = BStack_1f8.bitsConsumed + uVar24 * -8;
          }
          else {
            BStack_1f8.ptr = (char *)((long)BStack_1f8.ptr - (ulong)(BStack_1f8.bitsConsumed >> 3));
            BStack_1f8.bitsConsumed = BStack_1f8.bitsConsumed & 7;
          }
          BStack_1f8.bitContainer = *(size_t *)BStack_1f8.ptr;
        }
        goto LAB_0022173d;
      }
      bVar30 = false;
      goto LAB_00221799;
    }
    goto LAB_002217dc;
  }
  goto LAB_002217e9;
LAB_0022170b:
  sStack_140 = sVar27;
LAB_0022173d:
  if (pbVar25 < dst) {
    lVar13 = 0;
    do {
      uVar12 = (BStack_1f8.bitContainer << ((byte)BStack_1f8.bitsConsumed & 0x3f)) >> 0x35;
      BStack_1f8.bitsConsumed = *(byte *)((long)DTable + uVar12 * 2 + 4) + BStack_1f8.bitsConsumed;
      pbVar25[lVar13] = *(byte *)((long)DTable + uVar12 * 2 + 5);
      lVar13 = lVar13 + 1;
    } while ((long)dst - (long)pbVar25 != lVar13);
  }
  pBVar9 = HStack_108.op[uVar16];
  HStack_108.op[uVar16] = pBVar9 + lVar11;
  bVar30 = pBVar9 + lVar11 == (BYTE *)dst;
  sVar8 = sVar27;
  if (!bVar30) {
    sVar8 = 0xffffffffffffffec;
  }
LAB_00221799:
  if (!bVar30) goto LAB_002217b6;
  bVar29 = 2 < uVar16;
  uVar16 = uVar16 + 1;
  sVar27 = sVar8;
  if (uVar16 == 4) goto LAB_002217b6;
  goto LAB_00221564;
LAB_002217b6:
  cSrcSize = (size_t)puStack_170;
  dst = pbStack_1a0;
  maxDstSize = sStack_68;
  if ((bVar29) && (sVar8 = sStack_68, sStack_68 == 0)) {
    __assert_fail("dstSize != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                  ,0x348,
                  "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
LAB_002217dc:
  cSrc = puStack_160;
  if (sVar8 != 0) {
    return sVar8;
  }
LAB_002217e9:
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar3 = *cSrc;
  uVar22 = (ulong)uVar3;
  uVar4 = *(ushort *)((long)cSrc + 2);
  uVar12 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 4);
  uVar16 = (ulong)uVar5;
  uVar14 = uVar22 + uVar12 + uVar16 + 6;
  puStack_170 = (ulong *)(cSrcSize - uVar14);
  if (maxDstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar14) {
    return 0xffffffffffffffec;
  }
  pbVar28 = (byte *)((long)dst + maxDstSize);
  sStack_140 = maxDstSize + 3 >> 2;
  pbStack_138 = (byte *)((long)dst + sStack_140);
  pbStack_128 = pbStack_138 + sStack_140;
  pbVar25 = pbStack_128 + sStack_140;
  if (pbVar28 < pbVar25) {
    return 0xffffffffffffffec;
  }
  BStack_1f8.start = (char *)((long)cSrc + uVar22 + 6);
  if (uVar22 == 0) {
    HStack_108.ip[2] = (BYTE *)0x0;
    HStack_108.ip[3] = (BYTE *)0x0;
    HStack_108.ip[0] = (byte *)0x0;
    HStack_108.ip[1]._0_4_ = 0;
    HStack_108.ip[1]._4_4_ = 0;
    HStack_108.op[0] = (BYTE *)0x0;
    uVar14 = 0xffffffffffffffb8;
  }
  else {
    HStack_108.ip[3] = (BYTE *)((long)cSrc + 6);
    HStack_108.op[0] = (BYTE *)((long)cSrc + 0xe);
    uVar14 = uVar22;
    if (uVar3 < 8) {
      HStack_108.ip[0] = (BYTE *)(ulong)(byte)*(ushort *)HStack_108.ip[3];
      switch(uVar3) {
      case 7:
        HStack_108.ip[0] =
             (BYTE *)((ulong)(byte)*(ushort *)((long)cSrc + 0xc) << 0x30 | (ulong)HStack_108.ip[0]);
      case 6:
        HStack_108.ip[0] = HStack_108.ip[0] + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
      case 5:
        HStack_108.ip[0] = HStack_108.ip[0] + ((ulong)(byte)*(ushort *)((long)cSrc + 10) << 0x20);
      case 4:
        HStack_108.ip[0] = HStack_108.ip[0] + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
      case 3:
        HStack_108.ip[0] = HStack_108.ip[0] + (ulong)(byte)*(ushort *)((long)cSrc + 8) * 0x10000;
      case 2:
        HStack_108.ip[0] = HStack_108.ip[0] + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
      default:
        bVar10 = *(byte *)((long)cSrc + uVar22 + 5);
        uVar24 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        HStack_108.ip[2] = HStack_108.ip[3];
        if (bVar10 == 0) {
          uVar14 = 0xffffffffffffffec;
          HStack_108.ip[1]._0_4_ = 0;
        }
        else {
          HStack_108.ip[1]._0_4_ = ~uVar24 + 9 + ((uint)uVar3 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      HStack_108.ip[2] = (BYTE *)((long)cSrc + uVar22 + -2);
      HStack_108.ip[0] = *(BYTE **)((long)cSrc + uVar22 + -2);
      bVar10 = *(byte *)((long)cSrc + uVar22 + 5);
      uVar24 = 0x1f;
      if (bVar10 != 0) {
        for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      HStack_108.ip[1]._0_4_ = ~uVar24 + 9;
      if (bVar10 == 0) {
        HStack_108.ip[1]._0_4_ = 0;
        uVar14 = 0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < uVar14) {
    return uVar14;
  }
  puStack_1b0 = (ulong *)((long)BStack_1f8.start + uVar12);
  if (uVar12 == 0) {
    BStack_1f8.ptr = (char *)0x0;
    BStack_1f8.start = (char *)0x0;
    BStack_1f8.bitContainer = 0;
    BStack_1f8.bitsConsumed = 0;
    BStack_1f8._12_4_ = 0;
    BStack_1f8.limitPtr = (char *)0x0;
    uVar12 = 0xffffffffffffffb8;
  }
  else {
    BStack_1f8.limitPtr = (char *)((long)cSrc + uVar22 + 0xe);
    if (uVar4 < 8) {
      BStack_1f8.bitContainer = (size_t)(byte)*(ulong *)BStack_1f8.start;
      switch(uVar4) {
      case 7:
        BStack_1f8.bitContainer =
             (ulong)*(byte *)((long)cSrc + uVar22 + 0xc) << 0x30 | BStack_1f8.bitContainer;
      case 6:
        BStack_1f8.bitContainer =
             BStack_1f8.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar22 + 0xb) << 0x28);
      case 5:
        BStack_1f8.bitContainer =
             BStack_1f8.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar22 + 10) << 0x20);
      case 4:
        BStack_1f8.bitContainer =
             BStack_1f8.bitContainer + (ulong)*(byte *)((long)cSrc + uVar22 + 9) * 0x1000000;
      case 3:
        BStack_1f8.bitContainer =
             BStack_1f8.bitContainer + (ulong)*(byte *)((long)cSrc + uVar22 + 8) * 0x10000;
      case 2:
        BStack_1f8.bitContainer =
             BStack_1f8.bitContainer + (ulong)*(byte *)((long)cSrc + uVar22 + 7) * 0x100;
      default:
        bVar10 = *(byte *)((long)puStack_1b0 + -1);
        uVar24 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        BStack_1f8.ptr = BStack_1f8.start;
        if (bVar10 == 0) {
          uVar12 = 0xffffffffffffffec;
          BStack_1f8.bitsConsumed = 0;
        }
        else {
          BStack_1f8.bitsConsumed = ~uVar24 + 9 + ((uint)uVar4 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      BStack_1f8.bitContainer = puStack_1b0[-1];
      bVar10 = *(byte *)((long)puStack_1b0 + -1);
      uVar24 = 0x1f;
      if (bVar10 != 0) {
        for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      BStack_1f8.bitsConsumed = ~uVar24 + 9;
      BStack_1f8.ptr = (char *)(puStack_1b0 + -1);
      if (bVar10 == 0) {
        uVar12 = 0xffffffffffffffff;
        BStack_1f8.bitsConsumed = 0;
      }
    }
  }
  if (0xffffffffffffff88 < uVar12) {
    return uVar12;
  }
  pbStack_180 = (byte *)((long)puStack_1b0 + uVar16);
  if (uVar16 == 0) {
    puStack_1b8 = (ulong *)0x0;
    puStack_1b0 = (ulong *)0x0;
    auStack_1c8 = (undefined1  [8])0x0;
    uStack_1c0._0_4_ = 0;
    uStack_1c0._4_4_ = 0;
    puStack_1a8 = (ulong *)0x0;
    uVar16 = 0xffffffffffffffb8;
  }
  else {
    puStack_1a8 = puStack_1b0 + 1;
    if (uVar5 < 8) {
      auStack_1c8 = (undefined1  [8])(ulong)(byte)*puStack_1b0;
      switch(uVar5) {
      case 7:
        auStack_1c8 = (undefined1  [8])
                      ((ulong)*(byte *)((long)puStack_1b0 + 6) << 0x30 | (ulong)auStack_1c8);
      case 6:
        auStack_1c8 = (undefined1  [8])
                      ((long)auStack_1c8 + ((ulong)*(byte *)((long)puStack_1b0 + 5) << 0x28));
      case 5:
        auStack_1c8 = (undefined1  [8])
                      ((long)auStack_1c8 + ((ulong)*(byte *)((long)puStack_1b0 + 4) << 0x20));
      case 4:
        auStack_1c8 = (undefined1  [8])
                      ((long)auStack_1c8 + (ulong)*(byte *)((long)puStack_1b0 + 3) * 0x1000000);
      case 3:
        auStack_1c8 = (undefined1  [8])
                      ((long)auStack_1c8 + (ulong)*(byte *)((long)puStack_1b0 + 2) * 0x10000);
      case 2:
        auStack_1c8 = (undefined1  [8])
                      ((long)auStack_1c8 + (ulong)*(byte *)((long)puStack_1b0 + 1) * 0x100);
      default:
        bVar10 = pbStack_180[-1];
        uVar24 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        puStack_1b8 = puStack_1b0;
        if (bVar10 == 0) {
          uVar16 = 0xffffffffffffffec;
          uStack_1c0._0_4_ = 0;
        }
        else {
          uStack_1c0._0_4_ = ~uVar24 + 9 + ((uint)uVar5 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      auStack_1c8 = *(undefined1 (*) [8])(pbStack_180 + -8);
      bVar10 = pbStack_180[-1];
      uVar24 = 0x1f;
      if (bVar10 != 0) {
        for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uStack_1c0._0_4_ = ~uVar24 + 9;
      puStack_1b8 = (ulong *)(pbStack_180 + -8);
      if (bVar10 == 0) {
        uVar16 = 0xffffffffffffffff;
        uStack_1c0._0_4_ = 0;
      }
    }
  }
  if (0xffffffffffffff88 < uVar16) {
    return uVar16;
  }
  if (puStack_170 == (ulong *)0x0) {
    pbStack_188 = (byte *)0x0;
    pbStack_180 = (byte *)0x0;
    auStack_198 = (undefined1  [8])0x0;
    uStack_190._0_4_ = 0;
    uStack_190._4_4_ = 0;
    pbStack_178 = (byte *)0x0;
    puVar17 = (ulong *)0xffffffffffffffb8;
  }
  else {
    pbStack_178 = pbStack_180 + 8;
    puVar17 = puStack_170;
    if (puStack_170 < (ulong *)0x8) {
      auStack_198 = (undefined1  [8])(ulong)*pbStack_180;
      switch(puStack_170) {
      case (ulong *)0x7:
        auStack_198 = (undefined1  [8])((ulong)pbStack_180[6] << 0x30 | (ulong)auStack_198);
      case (ulong *)0x6:
        auStack_198 = (undefined1  [8])((long)auStack_198 + ((ulong)pbStack_180[5] << 0x28));
      case (ulong *)0x5:
        auStack_198 = (undefined1  [8])((long)auStack_198 + ((ulong)pbStack_180[4] << 0x20));
      case (ulong *)0x4:
        auStack_198 = (undefined1  [8])((long)auStack_198 + (ulong)pbStack_180[3] * 0x800000 * 2);
      case (ulong *)0x3:
        auStack_198 = (undefined1  [8])((long)auStack_198 + (ulong)pbStack_180[2] * 0x8000 * 2);
      case (ulong *)0x2:
        auStack_198 = (undefined1  [8])((long)auStack_198 + (ulong)pbStack_180[1] * 0x80 * 2);
      default:
        bVar10 = (pbStack_180 + -1)[(long)puStack_170];
        uVar24 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        pbStack_188 = pbStack_180;
        if (bVar10 == 0) {
          uStack_190._0_4_ = 0;
          puVar17 = (ulong *)0xffffffffffffffec;
        }
        else {
          uStack_190._0_4_ = ~uVar24 + (int)puStack_170 * -8 + 0x49;
        }
      }
    }
    else {
      pbStack_188 = pbStack_180 + (long)puStack_170 + -8;
      auStack_198 = *(undefined1 (*) [8])pbStack_188;
      bVar10 = (pbStack_180 + (long)puStack_170)[-1];
      uVar24 = 0x1f;
      if (bVar10 != 0) {
        for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uStack_190._0_4_ = ~uVar24 + 9;
      if (bVar10 == 0) {
        uStack_190._0_4_ = 0;
        puVar17 = (ulong *)0xffffffffffffffff;
      }
    }
  }
  if ((ulong *)0xffffffffffffff88 < puVar17) {
    return (size_t)puVar17;
  }
  pbStack_110 = (byte *)((long)dst + maxDstSize) + -3;
  uVar3 = *(ushort *)((long)DTable + 2);
  uStack_158 = (ulong)uVar3;
  cVar20 = (char)uVar3;
  pbVar15 = pbStack_128;
  pbVar26 = pbStack_138;
  pbVar19 = pbVar25;
  pbStack_1a0 = (byte *)dst;
  pbStack_60 = pbVar28;
  if (7 < (ulong)((long)pbVar28 - (long)pbVar25)) {
    pbStack_168 = HStack_108.ip[0];
    uStack_148 = (ulong)auStack_1c8;
    puStack_160 = (ushort *)auStack_198;
    sStack_68 = maxDstSize;
    if (pbVar25 < pbStack_110) {
      pbStack_130 = pbVar25;
      if (cVar20 == '\0') goto LAB_00222dee;
      uStack_40 = (ulong)(-(uint)uVar3 & 0x3f);
      puStack_48 = (ulong *)BStack_1f8.limitPtr;
      puStack_50 = puStack_1a8;
      pbStack_58 = pbStack_178;
      puStack_38 = (ushort *)HStack_108.op[0];
      pbStack_120 = pbStack_188;
      puStack_170 = puStack_1b8;
      puStack_150 = (ulong *)BStack_1f8.ptr;
      puStack_118 = (ushort *)HStack_108.ip[2];
      pbStack_1d0 = (byte *)(sStack_140 * 3);
      pbStack_1a0 = (byte *)BStack_1f8.bitContainer;
      do {
        pbVar15 = (byte *)dst;
        sVar6 = (sbyte)(-(uint)uVar3 & 0x3f);
        uVar16 = (ulong)((long)pbStack_168 << ((byte)(uint)HStack_108.ip[1] & 0x3f)) >> sVar6;
        iVar21 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)HStack_108.ip[1];
        *pbVar15 = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)pbStack_1a0 << ((byte)BStack_1f8.bitsConsumed & 0x3f)) >> sVar6;
        iVar23 = *(byte *)((long)DTable + uVar16 * 2 + 4) + BStack_1f8.bitsConsumed;
        uVar12 = (uStack_148 << ((byte)(uint)uStack_1c0 & 0x3f)) >> sVar6;
        pbVar15[sStack_140] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)puStack_160 << ((byte)(uint)uStack_190 & 0x3f)) >> sVar6;
        iVar18 = *(byte *)((long)DTable + uVar12 * 2 + 4) + (uint)uStack_1c0;
        pbVar15[sStack_140 * 2] = *(byte *)((long)DTable + uVar12 * 2 + 5);
        iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_190;
        pbVar15[(long)pbStack_1d0] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)pbStack_168 << ((byte)iVar21 & 0x3f)) >> sVar6;
        iVar21 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar21;
        pbVar15[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)pbStack_1a0 << ((byte)iVar23 & 0x3f)) >> sVar6;
        iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar23;
        uVar12 = (uStack_148 << ((byte)iVar18 & 0x3f)) >> sVar6;
        pbVar15[sStack_140 + 1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)puStack_160 << ((byte)iVar7 & 0x3f)) >> sVar6;
        iVar18 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar18;
        pbVar15[sStack_140 * 2 + 1] = *(byte *)((long)DTable + uVar12 * 2 + 5);
        iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
        pbVar15[(long)(pbStack_1d0 + 1)] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)pbStack_168 << ((byte)iVar21 & 0x3f)) >> sVar6;
        iVar21 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar21;
        pbVar15[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)pbStack_1a0 << ((byte)iVar23 & 0x3f)) >> sVar6;
        iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar23;
        uVar12 = (uStack_148 << ((byte)iVar18 & 0x3f)) >> sVar6;
        pbVar15[sStack_140 + 2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)puStack_160 << ((byte)iVar7 & 0x3f)) >> sVar6;
        iVar18 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar18;
        pbVar15[sStack_140 * 2 + 2] = *(byte *)((long)DTable + uVar12 * 2 + 5);
        iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
        pbVar15[(long)(pbStack_1d0 + 2)] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)pbStack_168 << ((byte)iVar21 & 0x3f)) >> sVar6;
        HStack_108.ip[1]._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar21;
        uVar14 = (ulong)((long)pbStack_1a0 << ((byte)iVar23 & 0x3f)) >> sVar6;
        uVar12 = (uStack_148 << ((byte)iVar18 & 0x3f)) >> sVar6;
        pbVar15[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        BStack_1f8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar23;
        pbVar15[sStack_140 + 3] = *(byte *)((long)DTable + uVar14 * 2 + 5);
        uStack_1c0._0_4_ = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar18;
        uVar16 = (ulong)((long)puStack_160 << ((byte)iVar7 & 0x3f)) >> sVar6;
        pbVar15[sStack_140 * 2 + 3] = *(byte *)((long)DTable + uVar12 * 2 + 5);
        uStack_190._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
        pbVar15[(long)(pbStack_1d0 + 3)] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        iVar7 = 3;
        BStack_1f8.bitContainer = (size_t)pbStack_1a0;
        if (HStack_108.op[0] <= puStack_118) {
          if ((uint)HStack_108.ip[1] < 0x41) {
            HStack_108.ip[2] = (BYTE *)((long)puStack_118 - (ulong)((uint)HStack_108.ip[1] >> 3));
            HStack_108.ip[1]._0_4_ = (uint)HStack_108.ip[1] & 7;
            pbStack_168 = *(byte **)HStack_108.ip[2];
            iVar23 = 0;
            goto LAB_00222191;
          }
          HStack_108.ip[2] = (BYTE *)puStack_118;
LAB_00222f5e:
          HStack_108.ip[0] = pbStack_168;
LAB_0022302c:
          pbStack_188 = pbStack_120;
          auStack_1c8 = (undefined1  [8])uStack_148;
          auStack_198 = (undefined1  [8])puStack_160;
          BStack_1f8.ptr = (char *)puStack_150;
          puStack_1b8 = puStack_170;
          pbStack_168 = HStack_108.ip[0];
          __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                        ,0x185,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
        }
        iVar23 = 3;
        HStack_108.ip[2] = (BYTE *)puStack_118;
LAB_00222191:
        if (BStack_1f8.limitPtr <= puStack_150) {
          if (0x40 < BStack_1f8.bitsConsumed) goto LAB_00222f5e;
          puStack_150 = (ulong *)((long)puStack_150 - (ulong)(BStack_1f8.bitsConsumed >> 3));
          BStack_1f8.bitsConsumed = BStack_1f8.bitsConsumed & 7;
          iVar7 = 0;
          BStack_1f8.bitContainer = *puStack_150;
        }
        iVar18 = 3;
        puStack_118 = (ushort *)HStack_108.ip[2];
        if (puStack_170 < puStack_1a8) {
          iVar21 = 3;
        }
        else {
          if (0x40 < (uint)uStack_1c0) {
            HStack_108.ip[0] = pbStack_168;
            goto LAB_0022302c;
          }
          puStack_170 = (ulong *)((long)puStack_170 - (ulong)((uint)uStack_1c0 >> 3));
          uStack_1c0._0_4_ = (uint)uStack_1c0 & 7;
          uStack_148 = *puStack_170;
          iVar21 = 0;
        }
        if (pbStack_178 <= pbStack_120) {
          if (0x40 < (uint)uStack_190) {
            HStack_108.ip[0] = pbStack_168;
            goto LAB_0022302c;
          }
          pbStack_120 = pbStack_120 + -(ulong)((uint)uStack_190 >> 3);
          uStack_190._0_4_ = (uint)uStack_190 & 7;
          puStack_160 = *(ushort **)pbStack_120;
          iVar18 = 0;
        }
      } while ((pbVar15 + (long)(pbStack_1d0 + 4) < pbStack_110) &&
              (dst = pbVar15 + 4, pbStack_1a0 = (byte *)BStack_1f8.bitContainer,
              ((iVar7 == 0 && iVar23 == 0) && iVar21 == 0) && iVar18 == 0));
      pbStack_1a0 = pbVar15 + 4;
      BStack_1f8.ptr = (char *)puStack_150;
      puStack_1b8 = puStack_170;
      pbStack_188 = pbStack_120;
      pbVar15 = pbStack_1a0 + sStack_140 * 2;
      pbVar26 = pbStack_1a0 + sStack_140;
      pbVar19 = pbStack_1a0 + (long)pbStack_1d0;
    }
    pbStack_1d0 = pbVar19;
    HStack_108.ip[0] = pbStack_168;
    auStack_1c8 = (undefined1  [8])uStack_148;
    auStack_198 = (undefined1  [8])puStack_160;
    pbVar19 = pbStack_1d0;
    pbStack_130 = pbVar25;
  }
  pbStack_1d0 = pbVar19;
  if (pbStack_138 < pbStack_1a0) {
    return 0xffffffffffffffec;
  }
  if (pbStack_128 < pbVar26) {
    return 0xffffffffffffffec;
  }
  if (pbVar25 < pbVar15) {
    return 0xffffffffffffffec;
  }
  if (3 < (long)pbStack_138 - (long)pbStack_1a0) {
    bVar10 = -cVar20 & 0x3f;
    do {
      if ((uint)HStack_108.ip[1] < 0x41) {
        if (HStack_108.ip[2] < HStack_108.op[0]) {
          if (HStack_108.ip[2] == HStack_108.ip[3]) goto LAB_00222401;
          bVar29 = HStack_108.ip[3] <=
                   (ushort *)((long)HStack_108.ip[2] - (ulong)((uint)HStack_108.ip[1] >> 3));
          uVar24 = (int)HStack_108.ip[2] - (int)HStack_108.ip[3];
          if (bVar29) {
            uVar24 = (uint)HStack_108.ip[1] >> 3;
          }
          HStack_108.ip[2] = (BYTE *)((long)HStack_108.ip[2] - (ulong)uVar24);
          HStack_108.ip[1]._0_4_ = (uint)HStack_108.ip[1] + uVar24 * -8;
          HStack_108.ip[0] = *(BYTE **)HStack_108.ip[2];
        }
        else {
          HStack_108.ip[2] = (BYTE *)((long)HStack_108.ip[2] - (ulong)((uint)HStack_108.ip[1] >> 3))
          ;
          HStack_108.ip[1]._0_4_ = (uint)HStack_108.ip[1] & 7;
          HStack_108.ip[0] = *(BYTE **)HStack_108.ip[2];
          bVar29 = true;
        }
      }
      else {
LAB_00222401:
        bVar29 = false;
      }
      if ((pbStack_138 + -3 <= pbStack_1a0) || (!bVar29)) goto LAB_00222642;
      if (cVar20 == '\0') goto LAB_00222dee;
      uVar16 = (ulong)((long)HStack_108.ip[0] << ((byte)(uint)HStack_108.ip[1] & 0x3f)) >> bVar10;
      iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)HStack_108.ip[1];
      *pbStack_1a0 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)HStack_108.ip[0] << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbStack_1a0[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)HStack_108.ip[0] << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbStack_1a0[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)HStack_108.ip[0] << ((byte)iVar7 & 0x3f)) >> bVar10;
      HStack_108.ip[1]._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbStack_1a0[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbStack_1a0 = pbStack_1a0 + 4;
    } while( true );
  }
  if ((uint)HStack_108.ip[1] < 0x41) {
    if (HStack_108.ip[2] < HStack_108.op[0]) {
      if (HStack_108.ip[2] != HStack_108.ip[3]) {
        uVar24 = (int)HStack_108.ip[2] - (int)HStack_108.ip[3];
        if (HStack_108.ip[3] <=
            (ushort *)((long)HStack_108.ip[2] - (ulong)((uint)HStack_108.ip[1] >> 3))) {
          uVar24 = (uint)HStack_108.ip[1] >> 3;
        }
        HStack_108.ip[2] = (BYTE *)((long)HStack_108.ip[2] - (ulong)uVar24);
        HStack_108.ip[1]._0_4_ = (uint)HStack_108.ip[1] + uVar24 * -8;
        HStack_108.ip[0] = *(BYTE **)HStack_108.ip[2];
      }
    }
    else {
      pbStack_130 = pbVar25;
      BIT_reloadDStreamFast((BIT_DStream_t *)&HStack_108);
      pbVar25 = pbStack_130;
    }
  }
LAB_00222642:
  cVar20 = (char)uStack_158;
  if (pbStack_1a0 < pbStack_138) {
    if (cVar20 == '\0') goto LAB_00222dee;
    pbVar19 = pbStack_1a0;
    do {
      uVar16 = (ulong)((long)HStack_108.ip[0] << ((byte)(uint)HStack_108.ip[1] & 0x3f)) >>
               (-cVar20 & 0x3fU);
      HStack_108.ip[1]._0_4_ = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)HStack_108.ip[1];
      *pbVar19 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 < pbStack_138);
  }
  if (3 < (long)pbStack_128 - (long)pbVar26) {
    bVar10 = -cVar20 & 0x3f;
    do {
      if (BStack_1f8.bitsConsumed < 0x41) {
        if (BStack_1f8.ptr < BStack_1f8.limitPtr) {
          if (BStack_1f8.ptr == BStack_1f8.start) goto LAB_002226cb;
          bVar29 = BStack_1f8.start <=
                   (ulong *)((long)BStack_1f8.ptr - (ulong)(BStack_1f8.bitsConsumed >> 3));
          uVar24 = (int)BStack_1f8.ptr - (int)BStack_1f8.start;
          if (bVar29) {
            uVar24 = BStack_1f8.bitsConsumed >> 3;
          }
          BStack_1f8.ptr = (char *)((long)BStack_1f8.ptr - (ulong)uVar24);
          BStack_1f8.bitsConsumed = BStack_1f8.bitsConsumed + uVar24 * -8;
          BStack_1f8.bitContainer = *(size_t *)BStack_1f8.ptr;
        }
        else {
          BStack_1f8.ptr = (char *)((long)BStack_1f8.ptr - (ulong)(BStack_1f8.bitsConsumed >> 3));
          BStack_1f8.bitsConsumed = BStack_1f8.bitsConsumed & 7;
          BStack_1f8.bitContainer = *(size_t *)BStack_1f8.ptr;
          bVar29 = true;
        }
      }
      else {
LAB_002226cb:
        bVar29 = false;
      }
      if ((pbStack_128 + -3 <= pbVar26) || (!bVar29)) goto LAB_0022288e;
      if (cVar20 == '\0') goto LAB_00222dee;
      uVar16 = (BStack_1f8.bitContainer << ((byte)BStack_1f8.bitsConsumed & 0x3f)) >> bVar10;
      iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + BStack_1f8.bitsConsumed;
      *pbVar26 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (BStack_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar26[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (BStack_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar26[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (BStack_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> bVar10;
      BStack_1f8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar26[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar26 = pbVar26 + 4;
    } while( true );
  }
  if (BStack_1f8.bitsConsumed < 0x41) {
    if (BStack_1f8.ptr < BStack_1f8.limitPtr) {
      if (BStack_1f8.ptr != BStack_1f8.start) {
        uVar24 = (int)BStack_1f8.ptr - (int)BStack_1f8.start;
        if (BStack_1f8.start <=
            (ulong *)((long)BStack_1f8.ptr - (ulong)(BStack_1f8.bitsConsumed >> 3))) {
          uVar24 = BStack_1f8.bitsConsumed >> 3;
        }
        BStack_1f8.ptr = (char *)((long)BStack_1f8.ptr - (ulong)uVar24);
        BStack_1f8.bitsConsumed = BStack_1f8.bitsConsumed + uVar24 * -8;
        BStack_1f8.bitContainer = *(size_t *)BStack_1f8.ptr;
      }
    }
    else {
      pbStack_130 = pbVar25;
      BIT_reloadDStreamFast(&BStack_1f8);
      pbVar25 = pbStack_130;
    }
  }
LAB_0022288e:
  cVar20 = (char)uStack_158;
  if (pbVar26 < pbStack_128) {
    if (cVar20 == '\0') goto LAB_00222dee;
    do {
      uVar16 = (BStack_1f8.bitContainer << ((byte)BStack_1f8.bitsConsumed & 0x3f)) >>
               (-cVar20 & 0x3fU);
      BStack_1f8.bitsConsumed = *(byte *)((long)DTable + uVar16 * 2 + 4) + BStack_1f8.bitsConsumed;
      *pbVar26 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 < pbStack_128);
  }
  if (3 < (long)pbVar25 - (long)pbVar15) {
    bVar10 = -cVar20 & 0x3f;
    do {
      if ((uint)uStack_1c0 < 0x41) {
        if (puStack_1b8 < puStack_1a8) {
          if (puStack_1b8 == puStack_1b0) goto LAB_00222900;
          bVar29 = puStack_1b0 <= (ulong *)((long)puStack_1b8 - (ulong)((uint)uStack_1c0 >> 3));
          uVar24 = (int)puStack_1b8 - (int)puStack_1b0;
          if (bVar29) {
            uVar24 = (uint)uStack_1c0 >> 3;
          }
          puStack_1b8 = (ulong *)((long)puStack_1b8 - (ulong)uVar24);
          uStack_1c0._0_4_ = (uint)uStack_1c0 + uVar24 * -8;
          auStack_1c8 = (undefined1  [8])*puStack_1b8;
        }
        else {
          puStack_1b8 = (ulong *)((long)puStack_1b8 - (ulong)((uint)uStack_1c0 >> 3));
          uStack_1c0._0_4_ = (uint)uStack_1c0 & 7;
          auStack_1c8 = (undefined1  [8])*puStack_1b8;
          bVar29 = true;
        }
      }
      else {
LAB_00222900:
        bVar29 = false;
      }
      if ((pbVar25 + -3 <= pbVar15) || (!bVar29)) goto LAB_00222ab5;
      if (cVar20 == '\0') goto LAB_00222dee;
      uVar16 = (ulong)((long)auStack_1c8 << ((byte)(uint)uStack_1c0 & 0x3f)) >> bVar10;
      iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_1c0;
      *pbVar15 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)auStack_1c8 << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar15[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)auStack_1c8 << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar15[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)auStack_1c8 << ((byte)iVar7 & 0x3f)) >> bVar10;
      uStack_1c0._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar15[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar15 = pbVar15 + 4;
    } while( true );
  }
  if ((uint)uStack_1c0 < 0x41) {
    if (puStack_1b8 < puStack_1a8) {
      if (puStack_1b8 != puStack_1b0) {
        uVar24 = (int)puStack_1b8 - (int)puStack_1b0;
        if (puStack_1b0 <= (ulong *)((long)puStack_1b8 - (ulong)((uint)uStack_1c0 >> 3))) {
          uVar24 = (uint)uStack_1c0 >> 3;
        }
        puStack_1b8 = (ulong *)((long)puStack_1b8 - (ulong)uVar24);
        uStack_1c0._0_4_ = (uint)uStack_1c0 + uVar24 * -8;
        auStack_1c8 = (undefined1  [8])*puStack_1b8;
      }
    }
    else {
      BIT_reloadDStreamFast((BIT_DStream_t *)auStack_1c8);
    }
  }
LAB_00222ab5:
  cVar20 = (char)uStack_158;
  if (pbVar15 < pbVar25) {
    if (cVar20 == '\0') goto LAB_00222dee;
    do {
      uVar16 = (ulong)((long)auStack_1c8 << ((byte)(uint)uStack_1c0 & 0x3f)) >> (-cVar20 & 0x3fU);
      uStack_1c0._0_4_ = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_1c0;
      *pbVar15 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 < pbVar25);
  }
  if (3 < (long)pbVar28 - (long)pbStack_1d0) {
    bVar10 = -cVar20 & 0x3f;
    do {
      if ((uint)uStack_190 < 0x41) {
        if (pbStack_188 < pbStack_178) {
          if (pbStack_188 == pbStack_180) goto LAB_00222b20;
          bVar29 = pbStack_180 <= pbStack_188 + -(ulong)((uint)uStack_190 >> 3);
          uVar24 = (int)pbStack_188 - (int)pbStack_180;
          if (bVar29) {
            uVar24 = (uint)uStack_190 >> 3;
          }
          pbStack_188 = pbStack_188 + -(ulong)uVar24;
          uStack_190._0_4_ = (uint)uStack_190 + uVar24 * -8;
          auStack_198 = *(undefined1 (*) [8])pbStack_188;
        }
        else {
          pbStack_188 = pbStack_188 + -(ulong)((uint)uStack_190 >> 3);
          uStack_190._0_4_ = (uint)uStack_190 & 7;
          auStack_198 = *(undefined1 (*) [8])pbStack_188;
          bVar29 = true;
        }
      }
      else {
LAB_00222b20:
        bVar29 = false;
      }
      if ((pbStack_110 <= pbStack_1d0) || (!bVar29)) goto LAB_00222cce;
      if (cVar20 == '\0') goto LAB_00222dee;
      uVar16 = (ulong)((long)auStack_198 << ((byte)(uint)uStack_190 & 0x3f)) >> bVar10;
      iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_190;
      *pbStack_1d0 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)auStack_198 << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbStack_1d0[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)auStack_198 << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbStack_1d0[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)auStack_198 << ((byte)iVar7 & 0x3f)) >> bVar10;
      uStack_190._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbStack_1d0[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbStack_1d0 = pbStack_1d0 + 4;
    } while( true );
  }
  if ((uint)uStack_190 < 0x41) {
    if (pbStack_188 < pbStack_178) {
      if (pbStack_188 != pbStack_180) {
        uVar24 = (int)pbStack_188 - (int)pbStack_180;
        if (pbStack_180 <= pbStack_188 + -(ulong)((uint)uStack_190 >> 3)) {
          uVar24 = (uint)uStack_190 >> 3;
        }
        pbStack_188 = pbStack_188 + -(ulong)uVar24;
        uStack_190._0_4_ = (uint)uStack_190 + uVar24 * -8;
        auStack_198 = *(undefined1 (*) [8])pbStack_188;
      }
    }
    else {
      BIT_reloadDStreamFast((BIT_DStream_t *)auStack_198);
      cVar20 = (char)uStack_158;
    }
  }
LAB_00222cce:
  if (pbStack_1d0 < pbVar28) {
    if (cVar20 == '\0') {
LAB_00222dee:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                    ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    do {
      uVar16 = (ulong)((long)auStack_198 << ((byte)(uint)uStack_190 & 0x3f)) >> (-cVar20 & 0x3fU);
      uStack_190._0_4_ = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_190;
      *pbStack_1d0 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbStack_1d0 = pbStack_1d0 + 1;
    } while (pbStack_1d0 < pbVar28);
  }
  if ((uint)uStack_190 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (pbStack_188 != pbStack_180) {
    maxDstSize = 0xffffffffffffffec;
  }
  if ((uint)uStack_1c0 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_1b8 != puStack_1b0) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (BStack_1f8.bitsConsumed != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (BStack_1f8.ptr != BStack_1f8.start) {
    maxDstSize = 0xffffffffffffffec;
  }
  if ((uint)HStack_108.ip[1] != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (HStack_108.ip[2] == HStack_108.ip[3]) {
    return maxDstSize;
  }
  return 0xffffffffffffffec;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}